

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall QtMWidgets::Picker::scrollTo(Picker *this,int index)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  int iVar3;
  PickerPrivate *pPVar4;
  int local_54;
  QPersistentModelIndex local_50 [4];
  int i;
  QPersistentModelIndex top;
  undefined1 local_30 [8];
  QModelIndex mi;
  int index_local;
  Picker *this_local;
  
  mi.m._4_4_ = index;
  iVar3 = count(this);
  pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
           ::operator->(&this->d);
  if (pPVar4->itemsCount < iVar3) {
    pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    iVar2 = mi.m._4_4_;
    pQVar1 = pPVar4->model;
    pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    iVar3 = pPVar4->modelColumn;
    QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>::
    operator->(&this->d);
    QPersistentModelIndex::operator_cast_to_QModelIndex(&top);
    (**(code **)(*(long *)pQVar1 + 0x60))(local_30,pQVar1,iVar2,iVar3,&top);
    QPersistentModelIndex::QPersistentModelIndex(local_50,(QModelIndex *)local_30);
    local_54 = 0;
    while( true ) {
      pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      if (pPVar4->itemsCount / 2 <= local_54) break;
      pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
               ::operator->(&this->d);
      PickerPrivate::makePrevIndex(pPVar4,local_50);
      local_54 = local_54 + 1;
    }
    pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    QPersistentModelIndex::operator=(&pPVar4->topItemIndex,local_50);
    pPVar4 = QScopedPointer<QtMWidgets::PickerPrivate,_QScopedPointerDeleter<QtMWidgets::PickerPrivate>_>
             ::operator->(&this->d);
    pPVar4->drawItemOffset = 0;
    QWidget::update();
    QPersistentModelIndex::~QPersistentModelIndex(local_50);
  }
  return;
}

Assistant:

void
Picker::scrollTo( int index )
{
	if( count() > d->itemsCount )
	{
		QModelIndex mi = d->model->index( index, d->modelColumn, d->root );
		QPersistentModelIndex top = mi;

		for( int i = 0; i < d->itemsCount / 2; ++i )
			d->makePrevIndex( top );

		d->topItemIndex = top;
		d->drawItemOffset = 0;

		update();
	}
}